

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O2

Vec4 __thiscall
deqp::gles2::Functional::calculateLodDerivateParts(Functional *this,Mat3 *transformation)

{
  Vec4 VVar1;
  Vec2 trans00;
  Vec2 trans10;
  Vec2 trans01;
  Vector<float,_3> local_78 [2];
  VecAccess<float,_3,_2> local_60;
  undefined8 local_50;
  undefined8 local_48;
  tcu local_3c [12];
  
  local_78[0].m_data[0] = 0.0;
  local_78[0].m_data[1] = 0.0;
  local_78[0].m_data[2] = 1.0;
  tcu::operator*(local_3c,transformation,local_78);
  local_60.m_index[0] = 0;
  local_60.m_index[1] = 1;
  local_60.m_vector = (Vector<float,_3> *)local_3c;
  tcu::VecAccess::operator_cast_to_Vector(&local_60);
  local_78[0].m_data[0] = 0.0;
  local_78[0].m_data[1] = 1.0;
  local_78[0].m_data[2] = 1.0;
  tcu::operator*(local_3c,transformation,local_78);
  local_60.m_index[0] = 0;
  local_60.m_index[1] = 1;
  local_60.m_vector = (Vector<float,_3> *)local_3c;
  tcu::VecAccess::operator_cast_to_Vector(&local_60);
  local_78[0].m_data[0] = 1.0;
  local_78[0].m_data[1] = 0.0;
  local_78[0].m_data[2] = 1.0;
  tcu::operator*(local_3c,transformation,local_78);
  local_60.m_index[0] = 0;
  local_60.m_index[1] = 1;
  local_60.m_vector = (Vector<float,_3> *)local_3c;
  tcu::VecAccess::operator_cast_to_Vector(&local_60);
  VVar1.m_data[0] = (float)local_78[1].m_data._4_8_;
  VVar1.m_data[1] = VVar1.m_data[0];
  *(float *)this = (float)local_50 - VVar1.m_data[0];
  *(float *)(this + 4) = (float)local_48 - VVar1.m_data[0];
  *(float *)(this + 8) = (float)((ulong)local_50 >> 0x20) - SUB84(local_78[1].m_data._4_8_,4);
  *(float *)(this + 0xc) = (float)((ulong)local_48 >> 0x20) - SUB84(local_78[1].m_data._4_8_,4);
  VVar1.m_data[2] = (float)(undefined4)local_48;
  VVar1.m_data[3] = (float)local_48._4_4_;
  return (Vec4)VVar1.m_data;
}

Assistant:

static Vec4 calculateLodDerivateParts(const Mat3& transformation)
{
	// Calculate transformed coordinates of three corners.
	Vec2 trans00 = (transformation * Vec3(0.0f, 0.0f, 1.0f)).xy();
	Vec2 trans01 = (transformation * Vec3(0.0f, 1.0f, 1.0f)).xy();
	Vec2 trans10 = (transformation * Vec3(1.0f, 0.0f, 1.0f)).xy();

	return Vec4(trans10.x() - trans00.x(),
				trans01.x() - trans00.x(),
				trans10.y() - trans00.y(),
				trans01.y() - trans00.y());
}